

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O1

FunctionSignatureParts * __thiscall
Jinx::Impl::FunctionSignature::GetParameters
          (FunctionSignatureParts *__return_storage_ptr__,FunctionSignature *this)

{
  pointer pFVar1;
  FunctionSignaturePart *part;
  pointer __x;
  
  (__return_storage_ptr__->
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar1 = (this->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->m_parts).
             super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pFVar1; __x = __x + 1) {
    if (__x->partType == Parameter) {
      std::
      vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
      ::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignatureParts FunctionSignature::GetParameters() const
	{
		FunctionSignatureParts parameters;
		for (auto & part : m_parts)
		{
			if (part.partType == FunctionSignaturePartType::Parameter)
				parameters.push_back(part);
		}
		return parameters;
	}